

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.h
# Opt level: O0

iterator __thiscall
eastl::
rbtree<char,_eastl::pair<const_char,_int>,_eastl::less<char>,_eastl::allocator,_eastl::use_first<eastl::pair<const_char,_int>_>,_true,_true>
::DoInsertValueImpl(rbtree<char,_eastl::pair<const_char,_int>,_eastl::less<char>,_eastl::allocator,_eastl::use_first<eastl::pair<const_char,_int>_>,_true,_true>
                    *this,node_type *pNodeParent,value_type *value,bool bForceToLeft)

{
  bool bVar1;
  result_type *a;
  result_type *b;
  node_type *pNode;
  undefined7 in_register_00000009;
  byte in_R8B;
  node_type *pNodeNew;
  RBTreeSide local_30;
  extract_key extractKey;
  RBTreeSide side;
  bool bForceToLeft_local;
  value_type *value_local;
  node_type *pNodeParent_local;
  rbtree<char,_eastl::pair<const_char,_int>,_eastl::less<char>,_eastl::allocator,_eastl::use_first<eastl::pair<const_char,_int>_>,_true,_true>
  *this_local;
  
  extractKey = (extract_key)(in_R8B & 1);
  if ((extractKey == (extract_key)0x0) &&
     (value != (value_type *)&(pNodeParent->super_rbtree_node_base).mpNodeLeft)) {
    a = use_first<eastl::pair<const_char,_int>_>::operator()
                  ((use_first<eastl::pair<const_char,_int>_> *)((long)&pNodeNew + 7),
                   (pair<const_char,_int> *)CONCAT71(in_register_00000009,bForceToLeft));
    b = use_first<eastl::pair<const_char,_int>_>::operator()
                  ((use_first<eastl::pair<const_char,_int>_> *)((long)&pNodeNew + 7),value + 4);
    bVar1 = less<char>::operator()((less<char> *)pNodeParent,a,b);
    if (!bVar1) {
      local_30 = kRBTreeSideRight;
      goto LAB_0010de62;
    }
  }
  local_30 = kRBTreeSideLeft;
LAB_0010de62:
  pNode = DoCreateNode((rbtree<char,_eastl::pair<const_char,_int>,_eastl::less<char>,_eastl::allocator,_eastl::use_first<eastl::pair<const_char,_int>_>,_true,_true>
                        *)pNodeParent,
                       (pair<const_char,_int> *)CONCAT71(in_register_00000009,bForceToLeft));
  RBTreeInsert(&pNode->super_rbtree_node_base,(rbtree_node_base *)value,
               (rbtree_node_base *)&(pNodeParent->super_rbtree_node_base).mpNodeLeft,local_30);
  *(int *)&pNodeParent[1].super_rbtree_node_base.mpNodeRight =
       *(int *)&pNodeParent[1].super_rbtree_node_base.mpNodeRight + 1;
  rbtree_iterator<eastl::pair<const_char,_int>,_eastl::pair<const_char,_int>_*,_eastl::pair<const_char,_int>_&>
  ::rbtree_iterator((rbtree_iterator<eastl::pair<const_char,_int>,_eastl::pair<const_char,_int>_*,_eastl::pair<const_char,_int>_&>
                     *)this,pNode);
  return (iterator)(node_type *)this;
}

Assistant:

typename rbtree<K, V, C, A, E, bM, bU>::iterator
    rbtree<K, V, C, A, E, bM, bU>::DoInsertValueImpl(node_type* pNodeParent, const value_type& value, bool bForceToLeft)
    {
        RBTreeSide side;
        extract_key extractKey;

        // The reason we may want to have bForceToLeft == true is that pNodeParent->mValue and value may be equal.
        // In that case it doesn't matter what side we insert on, except that the C++ LWG #233 improvement report
        // suggests that we should use the insert hint position to force an ordering. So that's what we do.
        if(bForceToLeft || (pNodeParent == &mAnchor) || mCompare(extractKey(value), extractKey(pNodeParent->mValue)))
            side = kRBTreeSideLeft;
        else
            side = kRBTreeSideRight;

        node_type* const pNodeNew = DoCreateNode(value); // Note that pNodeNew->mpLeft, mpRight, mpParent, will be uninitialized.
        RBTreeInsert(pNodeNew, pNodeParent, &mAnchor, side);
        mnSize++;

        return iterator(pNodeNew);
    }